

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

symbol * get_base_symbol_type(dmr_C *C,access_data *ad)

{
  symbol *local_20;
  symbol *orig_type;
  access_data *ad_local;
  dmr_C *C_local;
  
  local_20 = (symbol *)0x0;
  if (ad->address->type == PSEUDO_SYM) {
    local_20 = (ad->address->field_5).sym;
  }
  else if ((ad->address->type == PSEUDO_REG) &&
          (((undefined1  [232])*(ad->address->field_5).sym & (undefined1  [232])0xff) ==
           (undefined1  [232])0x29)) {
    local_20 = (symbol *)((ad->address->field_5).sym)->scope;
  }
  if (local_20 != (symbol *)0x0) {
    if (((undefined1  [232])*local_20 & (undefined1  [232])0xff) == (undefined1  [232])0x3) {
      local_20 = (local_20->field_14).field_2.ctype.base_type;
    }
    if (((undefined1  [232])*local_20 & (undefined1  [232])0xff) == (undefined1  [232])0x4) {
      local_20 = (local_20->field_14).field_2.ctype.base_type;
    }
  }
  return local_20;
}

Assistant:

static struct symbol *get_base_symbol_type(struct dmr_C *C, struct access_data *ad) {
        (void) C;
	struct symbol *orig_type = NULL;
	if (ad->address->type == PSEUDO_SYM) {
		orig_type = ad->address->sym;
	}
	else if (ad->address->type == PSEUDO_REG) {
		if (ad->address->def->opcode == OP_LOAD) {
			orig_type = ad->address->def->orig_type;
		}
	}
	if (orig_type) {
		if (orig_type->type == SYM_NODE)
			orig_type = orig_type->ctype.base_type;
		if (orig_type->type == SYM_PTR)
			orig_type = orig_type->ctype.base_type;
		//dmrC_show_type(C, orig_type);
	}
	return orig_type;
}